

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapParse.c
# Opt level: O3

int Amap_LibParseEquations(Amap_Lib_t *p,int fVerbose)

{
  uint uVar1;
  void *pvVar2;
  void *pvVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t *vTruth;
  int *piVar6;
  Vec_Ptr_t *vVarNames;
  void **ppvVar7;
  Hop_Man_t *p_00;
  Vec_Ptr_t *pVVar8;
  char *pcVar9;
  Hop_Obj_t *pRoot;
  uint *pTruth;
  char *pcVar10;
  size_t __size;
  undefined8 *puVar11;
  ulong uVar12;
  long lVar13;
  
  iVar4 = Amap_LibNumPinsMax(p);
  if (0xf < iVar4) {
    printf("Gates with more than %d inputs will be ignored.\n",0xf);
  }
  vTruth = (Vec_Int_t *)malloc(0x10);
  vTruth->nCap = 0x10000;
  vTruth->nSize = 0;
  piVar6 = (int *)malloc(0x40000);
  vTruth->pArray = piVar6;
  vVarNames = (Vec_Ptr_t *)malloc(0x10);
  vVarNames->nCap = 100;
  vVarNames->nSize = 0;
  ppvVar7 = (void **)malloc(800);
  vVarNames->pArray = ppvVar7;
  iVar5 = 0;
  p_00 = Hop_ManStart();
  Hop_IthVar(p_00,iVar4 + -1);
  pVVar8 = p->vGates;
  if (0 < pVVar8->nSize) {
    iVar4 = 100;
    lVar13 = 0;
    do {
      pvVar2 = pVVar8->pArray[lVar13];
      if (*(uint *)((long)pvVar2 + 0x38) < 0x1000000) {
        pcVar9 = Aig_MmFlexEntryFetch(p->pMemGates,4);
        *(char **)((long)pvVar2 + 0x30) = pcVar9;
        pcVar10 = *(char **)((long)pvVar2 + 0x28);
        iVar5 = strcmp(pcVar10,"CONST0");
        if (iVar5 == 0) {
          pcVar9[0] = '\0';
          pcVar9[1] = '\0';
          pcVar9[2] = '\0';
          pcVar9[3] = '\0';
        }
        else {
          iVar5 = strcmp(pcVar10,"CONST1");
          if (iVar5 != 0) {
            printf("Cannot parse formula \"%s\" of gate \"%s\" with no pins.\n",pcVar10,
                   *(undefined8 *)((long)pvVar2 + 0x10));
            break;
          }
          pcVar9[0] = -1;
          pcVar9[1] = -1;
          pcVar9[2] = -1;
          pcVar9[3] = -1;
        }
      }
      else if (*(uint *)((long)pvVar2 + 0x38) < 0x10000000) {
        __size = 0;
        iVar5 = 0;
        uVar12 = 0;
        puVar11 = (undefined8 *)((long)pvVar2 + 0x40);
        do {
          pvVar3 = (void *)*puVar11;
          if ((int)uVar12 == iVar4) {
            ppvVar7 = vVarNames->pArray;
            if (uVar12 < 0x10) {
              if (ppvVar7 == (void **)0x0) {
                ppvVar7 = (void **)malloc(0x80);
              }
              else {
                ppvVar7 = (void **)realloc(ppvVar7,0x80);
              }
              vVarNames->pArray = ppvVar7;
              iVar4 = 0x10;
            }
            else {
              if (ppvVar7 == (void **)0x0) {
                ppvVar7 = (void **)malloc(__size);
              }
              else {
                ppvVar7 = (void **)realloc(ppvVar7,__size);
              }
              vVarNames->pArray = ppvVar7;
              iVar4 = iVar5;
            }
          }
          else {
            ppvVar7 = vVarNames->pArray;
          }
          ppvVar7[uVar12] = pvVar3;
          uVar12 = uVar12 + 1;
          puVar11 = puVar11 + 9;
          iVar5 = iVar5 + 2;
          __size = __size + 0x10;
        } while (puVar11 < (undefined8 *)((long)pvVar2 + 0x40) +
                           (ulong)*(byte *)((long)pvVar2 + 0x3b) * 9);
        vVarNames->nSize = (int)uVar12;
        vVarNames->nCap = iVar4;
        pRoot = Amap_ParseFormula(_stdout,*(char **)((long)pvVar2 + 0x28),vVarNames,p_00,
                                  *(char **)((long)pvVar2 + 0x10));
        if (pRoot == (Hop_Obj_t *)0x0) break;
        pTruth = Hop_ManConvertAigToTruth(p_00,pRoot,(uint)*(byte *)((long)pvVar2 + 0x3b),vTruth,0);
        iVar5 = Kit_TruthSupportSize(pTruth,(uint)*(byte *)((long)pvVar2 + 0x3b));
        uVar1 = *(uint *)((long)pvVar2 + 0x38);
        if (iVar5 < (int)(uVar1 >> 0x18)) {
          if (fVerbose != 0) {
            printf("Skipping gate \"%s\" because its output \"%s\" does not depend on all input variables.\n"
                   ,*(undefined8 *)((long)pvVar2 + 0x10),*(undefined8 *)((long)pvVar2 + 0x28));
          }
        }
        else {
          iVar5 = 4 << ((char)(uVar1 >> 0x18) - 5U & 0x1f);
          if (uVar1 < 0x6000000) {
            iVar5 = 4;
          }
          pcVar10 = Aig_MmFlexEntryFetch(p->pMemGates,iVar5);
          *(char **)((long)pvVar2 + 0x30) = pcVar10;
          iVar5 = 1 << ((char)(*(uint *)((long)pvVar2 + 0x38) >> 0x18) - 5U & 0x1f);
          if (*(uint *)((long)pvVar2 + 0x38) < 0x6000000) {
            iVar5 = 1;
          }
          memcpy(pcVar10,pTruth,(long)iVar5 << 2);
        }
      }
      lVar13 = lVar13 + 1;
      pVVar8 = p->vGates;
    } while (lVar13 < pVVar8->nSize);
    iVar5 = (int)lVar13;
  }
  if (vVarNames->pArray != (void **)0x0) {
    free(vVarNames->pArray);
  }
  free(vVarNames);
  if (vTruth->pArray != (int *)0x0) {
    free(vTruth->pArray);
  }
  free(vTruth);
  Hop_ManStop(p_00);
  return (int)(iVar5 == p->vGates->nSize);
}

Assistant:

int Amap_LibParseEquations( Amap_Lib_t * p, int fVerbose )
{
//    extern int Kit_TruthSupportSize( unsigned * pTruth, int nVars );
    Hop_Man_t * pMan;
    Hop_Obj_t * pObj;
    Vec_Ptr_t * vNames;
    Vec_Int_t * vTruth;
    Amap_Gat_t * pGate;
    Amap_Pin_t * pPin;
    unsigned * pTruth;
    int i, nPinMax;
    nPinMax = Amap_LibNumPinsMax(p);
    if ( nPinMax > AMAP_MAXINS )
        printf( "Gates with more than %d inputs will be ignored.\n", AMAP_MAXINS );
    vTruth = Vec_IntAlloc( 1 << 16 );
    vNames = Vec_PtrAlloc( 100 );
    pMan = Hop_ManStart();
    Hop_IthVar( pMan, nPinMax - 1 );
    Vec_PtrForEachEntry( Amap_Gat_t *, p->vGates, pGate, i )
    {
        if ( pGate->nPins == 0 )
        {
            pGate->pFunc = (unsigned *)Aig_MmFlexEntryFetch( p->pMemGates, 4 );
            if ( strcmp( pGate->pForm, AMAP_STRING_CONST0 ) == 0 )
                pGate->pFunc[0] = 0;
            else if ( strcmp( pGate->pForm, AMAP_STRING_CONST1 ) == 0 )
                pGate->pFunc[0] = ~0;
            else
            {
                printf( "Cannot parse formula \"%s\" of gate \"%s\" with no pins.\n", pGate->pForm, pGate->pName );
                break;
            }
            continue;
        }
        if ( pGate->nPins > AMAP_MAXINS )
            continue;
        Vec_PtrClear( vNames );
        Amap_GateForEachPin( pGate, pPin )
            Vec_PtrPush( vNames, pPin->pName );
        pObj = Amap_ParseFormula( stdout, pGate->pForm, vNames, pMan, pGate->pName );
        if ( pObj == NULL )
            break;
        pTruth = Hop_ManConvertAigToTruth( pMan, pObj, pGate->nPins, vTruth, 0 );
        if ( Kit_TruthSupportSize(pTruth, pGate->nPins) < (int)pGate->nPins )
        {
            if ( fVerbose )
                printf( "Skipping gate \"%s\" because its output \"%s\" does not depend on all input variables.\n", pGate->pName, pGate->pForm );
            continue;
        }
        pGate->pFunc = (unsigned *)Aig_MmFlexEntryFetch( p->pMemGates, sizeof(unsigned)*Abc_TruthWordNum(pGate->nPins) );
        memcpy( pGate->pFunc, pTruth, sizeof(unsigned)*Abc_TruthWordNum(pGate->nPins) );
    }
    Vec_PtrFree( vNames );
    Vec_IntFree( vTruth );
    Hop_ManStop( pMan );
    return i == Vec_PtrSize(p->vGates);
}